

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

_Bool Curl_bufq_peek_at(bufq *q,size_t offset,uchar **pbuf,size_t *plen)

{
  bufc_pool *pbVar1;
  _Bool _Var2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  do {
    uVar4 = offset;
    q = (bufq *)q->head;
    if (q == (bufq *)0x0) {
LAB_001127cc:
      *pbuf = (uchar *)0x0;
      sVar5 = 0;
      _Var2 = false;
      goto LAB_001127ea;
    }
    pbVar1 = q->pool;
    uVar6 = (long)pbVar1 - (long)q->spare;
    if (uVar6 == 0) goto LAB_001127cc;
    offset = uVar4 - uVar6;
  } while (uVar6 <= uVar4);
  lVar3 = (long)&q->spare->next + uVar4;
  *pbuf = ((anon_union_8_2_4f9aec01_for_x *)&q->chunk_count)->data + lVar3;
  sVar5 = (long)pbVar1 - lVar3;
  _Var2 = true;
LAB_001127ea:
  *plen = sVar5;
  return _Var2;
}

Assistant:

bool Curl_bufq_peek_at(struct bufq *q, size_t offset,
                       const unsigned char **pbuf, size_t *plen)
{
  struct buf_chunk *c = q->head;
  size_t clen;

  while(c) {
    clen = chunk_len(c);
    if(!clen)
      break;
    if(offset >= clen) {
      offset -= clen;
      c = c->next;
      continue;
    }
    chunk_peek_at(c, offset, pbuf, plen);
    return TRUE;
  }
  *pbuf = NULL;
  *plen = 0;
  return FALSE;
}